

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

string * cmLocalGeneratorMD5_abi_cxx11_(string *__return_storage_ptr__,char *input)

{
  allocator local_41;
  cmsysMD5 *local_40;
  cmsysMD5 *md5;
  char md5out [32];
  char *input_local;
  
  md5out._24_8_ = input;
  local_40 = cmsysMD5_New();
  cmsysMD5_Initialize(local_40);
  cmsysMD5_Append(local_40,(uchar *)md5out._24_8_,-1);
  cmsysMD5_FinalizeHex(local_40,(char *)&md5);
  cmsysMD5_Delete(local_40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,(char *)&md5,0x20,&local_41);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  return __return_storage_ptr__;
}

Assistant:

static std::string cmLocalGeneratorMD5(const char* input)
{
  char md5out[32];
  cmsysMD5* md5 = cmsysMD5_New();
  cmsysMD5_Initialize(md5);
  cmsysMD5_Append(md5, reinterpret_cast<unsigned char const*>(input), -1);
  cmsysMD5_FinalizeHex(md5, md5out);
  cmsysMD5_Delete(md5);
  return std::string(md5out, 32);
}